

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

int __thiscall asmjit::_abi_1_10::Zone::dup(Zone *this,int __fd)

{
  uint8_t *__dest;
  byte in_CL;
  size_t in_RDX;
  undefined4 in_register_00000034;
  ulong size;
  
  __dest = (uint8_t *)0x0;
  if (((void *)CONCAT44(in_register_00000034,__fd) != (void *)0x0) && (in_RDX != 0)) {
    if (in_RDX == 0xffffffffffffffff) {
      dup((int)this);
    }
    else {
      size = in_CL + in_RDX;
      __dest = this->_ptr;
      if (__dest < this->_end && size <= (ulong)((long)this->_end - (long)__dest)) {
        this->_ptr = __dest + size;
      }
      else {
        __dest = (uint8_t *)_alloc(this,size,1);
      }
      if (__dest != (uint8_t *)0x0) {
        memcpy(__dest,(void *)CONCAT44(in_register_00000034,__fd),in_RDX);
        if (in_CL != 0) {
          __dest[in_RDX] = '\0';
        }
        goto LAB_00129812;
      }
    }
    __dest = (uint8_t *)0x0;
  }
LAB_00129812:
  return (int)__dest;
}

Assistant:

void* Zone::dup(const void* data, size_t size, bool nullTerminate) noexcept {
  if (ASMJIT_UNLIKELY(!data || !size))
    return nullptr;

  ASMJIT_ASSERT(size != SIZE_MAX);
  uint8_t* m = allocT<uint8_t>(size + nullTerminate);
  if (ASMJIT_UNLIKELY(!m)) return nullptr;

  memcpy(m, data, size);
  if (nullTerminate) m[size] = '\0';

  return static_cast<void*>(m);
}